

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

uint8_t * __thiscall arangodb::velocypack::Builder::add(Builder *this,ObjectIterator *sub)

{
  bool bVar1;
  reference pvVar2;
  Exception *this_00;
  undefined8 uVar3;
  ObjectIterator *in_RSI;
  long in_RDI;
  ObjectPair current;
  ValueLength oldPos;
  ValueLength pos;
  Slice *in_stack_ffffffffffffffa8;
  Builder *in_stack_ffffffffffffffb0;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffc0;
  ObjectIterator *this_01;
  
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)in_stack_ffffffffffffffb0,
               (ExceptionType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  pvVar2 = std::
           vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffffb0);
  bVar1 = false;
  if (*(char *)(*(long *)(in_RDI + 0x18) + pvVar2->startPos) != '\v') {
    bVar1 = *(char *)(*(long *)(in_RDI + 0x18) + pvVar2->startPos) != '\x14';
  }
  if (!bVar1) {
    if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
      this_01 = *(ObjectIterator **)(in_RDI + 0x20);
      while( true ) {
        bVar1 = ObjectIterator::valid(in_RSI);
        if (!bVar1) break;
        ObjectIterator::operator*(this_01);
        add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        ObjectIterator::next(this_01);
      }
      return (uint8_t *)((long)&(this_01->_slice)._start + *(long *)(in_RDI + 0x18));
    }
    uVar3 = __cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)in_stack_ffffffffffffffb0,(ExceptionType)((ulong)uVar3 >> 0x20));
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(ExceptionType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t* Builder::add(ObjectIterator&& sub) {
  if (VELOCYPACK_UNLIKELY(_stack.empty())) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  ValueLength const pos = _stack.back().startPos;
  if (VELOCYPACK_UNLIKELY(_start[pos] != 0x0b && _start[pos] != 0x14)) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  if (VELOCYPACK_UNLIKELY(_keyWritten)) {
    throw Exception(Exception::BuilderKeyAlreadyWritten);
  }
  auto const oldPos = _pos;
  while (sub.valid()) {
    auto current = (*sub);
    add(current.key);
    add(current.value);
    sub.next();
  }
  return _start + oldPos;
}